

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::ReadControllerJoints(ColladaParser *this,Controller *pController)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *__s1;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string *psVar4;
  string sStack_1c8;
  string local_1a8 [11];
  undefined4 extraout_var;
  
LAB_003fabf1:
  do {
    while( true ) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar2 == '\0') {
        return;
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) break;
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"joints");
        if (iVar2 == 0) {
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,"Expected end of <joints> element.",
                   (allocator<char> *)&sStack_1c8);
        ThrowException(this,local_1a8);
      }
    }
    bVar1 = IsElement(this,"input");
    if (bVar1) {
      uVar3 = GetAttribute(this,"semantic");
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
      __s1 = (char *)CONCAT44(extraout_var,iVar2);
      uVar3 = GetAttribute(this,"source");
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
      if (*(char *)CONCAT44(extraout_var_00,iVar2) != '#') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::operator<<((ostream *)local_1a8,"Unsupported URL format in \"");
        std::operator<<((ostream *)local_1a8,(char *)CONCAT44(extraout_var_00,iVar2));
        std::operator<<((ostream *)local_1a8,
                        "\" in source attribute of <joints> data <input> element");
        std::__cxx11::stringbuf::str();
        ThrowException(this,&sStack_1c8);
      }
      iVar2 = strcmp(__s1,"JOINT");
      psVar4 = &pController->mJointNameSource;
      if ((iVar2 != 0) &&
         (iVar2 = strcmp(__s1,"INV_BIND_MATRIX"), psVar4 = &pController->mJointOffsetMatrixSource,
         iVar2 != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::operator<<((ostream *)local_1a8,"Unknown semantic \"");
        std::operator<<((ostream *)local_1a8,__s1);
        std::operator<<((ostream *)local_1a8,"\" in <joints> data <input> element");
        std::__cxx11::stringbuf::str();
        ThrowException(this,&sStack_1c8);
      }
      std::__cxx11::string::assign((char *)psVar4);
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
      if ((char)iVar2 != '\0') goto LAB_003fabf1;
    }
    SkipElement(this);
  } while( true );
}

Assistant:

void ColladaParser::ReadControllerJoints(Collada::Controller& pController)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // Input channels for joint data. Two possible semantics: "JOINT" and "INV_BIND_MATRIX"
            if (IsElement("input"))
            {
                int indexSemantic = GetAttribute("semantic");
                const char* attrSemantic = mReader->getAttributeValue(indexSemantic);
                int indexSource = GetAttribute("source");
                const char* attrSource = mReader->getAttributeValue(indexSource);

                // local URLS always start with a '#'. We don't support global URLs
                if (attrSource[0] != '#')
                    ThrowException(format() << "Unsupported URL format in \"" << attrSource << "\" in source attribute of <joints> data <input> element");
                attrSource++;

                // parse source URL to corresponding source
                if (strcmp(attrSemantic, "JOINT") == 0)
                    pController.mJointNameSource = attrSource;
                else if (strcmp(attrSemantic, "INV_BIND_MATRIX") == 0)
                    pController.mJointOffsetMatrixSource = attrSource;
                else
                    ThrowException(format() << "Unknown semantic \"" << attrSemantic << "\" in <joints> data <input> element");

                // skip inner data, if present
                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "joints") != 0)
                ThrowException("Expected end of <joints> element.");

            break;
        }
    }
}